

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::EntityType::Decode(EntityType *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (7 < KVar1) {
    KDataStream::Read(stream,&this->m_ui8EntityKind);
    KDataStream::Read(stream,&this->m_ui8Domain);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Country);
    KDataStream::Read(stream,&this->m_ui8Category);
    KDataStream::Read(stream,&this->m_ui8SubCategory);
    KDataStream::Read(stream,&this->m_ui8Specific);
    KDataStream::Read(stream,&this->m_ui8Extra);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void EntityType::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < ENTITY_TYPE_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8EntityKind
           >> m_ui8Domain
           >> m_ui16Country
           >> m_ui8Category
           >> m_ui8SubCategory
           >> m_ui8Specific
           >> m_ui8Extra;
}